

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

JSONWriter * __thiscall
hgdb::json::JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>
          (JSONWriter *this,basic_string_view<char,_std::char_traits<char>_> value)

{
  undefined1 *puVar1;
  ostream *poVar2;
  char *in_RCX;
  string_view value_00;
  string local_60;
  JSONWriter *local_40;
  char local_31;
  
  value_00._M_len = value._M_str;
  puVar1 = &(this->s_).field_0x10;
  local_60._M_dataplus._M_p._0_1_ = 0x22;
  local_40 = this;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_60,1)
  ;
  value_00._M_str = in_RCX;
  escape_abi_cxx11_(&local_60,(JSONWriter *)value._M_len,value_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                              local_60._M_dataplus._M_p._0_1_),
                      local_60._M_string_length);
  local_31 = '\"';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_60._M_dataplus._M_p._1_7_,local_60._M_dataplus._M_p._0_1_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p._0_1_ = 0x2c;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,(char *)&local_60,1);
  return local_40;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }